

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O0

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,24ul,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char (*args_s) [24],int *args,int *args_1,int *args_2,
               shared_ptr<Bar> *args_3,shared_ptr<Bar> *args_4,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_5)

{
  char cVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  reference this;
  bool bVar6;
  ulong local_180;
  size_t i_1;
  char *a [6];
  ulong local_140;
  size_t i;
  size_t pos;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL> array;
  allocator<char> local_59;
  string local_58 [8];
  string s;
  shared_ptr<Bar> *args_local_3;
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  char (*args_s_local) [24];
  AutoLoadVisitor visitor_local;
  
  s.field_2._8_8_ = args_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,*args_s,&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
         *)&pos);
  i = 0;
  for (local_140 = 0;
      sVar3 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
              ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                      *)&pos), local_140 < sVar3; local_140 = local_140 + 1) {
    while( true ) {
      uVar4 = std::__cxx11::string::length();
      bVar6 = false;
      if (i < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        iVar2 = isspace((int)*pcVar5);
        bVar6 = iVar2 != 0;
      }
      if (!bVar6) break;
      i = i + 1;
    }
    while( true ) {
      uVar4 = std::__cxx11::string::length();
      bVar6 = false;
      if (i < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        bVar6 = *pcVar5 != ',';
      }
      if (!bVar6) break;
      i = i + 1;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      cVar1 = *pcVar5;
      this = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                           *)&pos,local_140);
      std::__cxx11::string::operator+=((string *)this,cVar1);
    }
    do {
      i = i + 1;
      uVar4 = std::__cxx11::string::length();
      bVar6 = false;
      if (i < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        iVar2 = isspace((int)*pcVar5);
        bVar6 = iVar2 != 0;
      }
    } while (bVar6);
  }
  for (local_180 = 0;
      sVar3 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
              ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                      *)&pos), local_180 < sVar3; local_180 = local_180 + 1) {
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)&pos,local_180);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    a[local_180 - 1] = pcVar5;
  }
  accept<miyuki::serialize::AutoLoadVisitor,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
            (visitor,(char **)&i_1,args,args_1,args_2,(shared_ptr<Bar> *)s.field_2._8_8_,args_4,
             args_5);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
          *)&pos);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void accept(Visitor visitor, const char (&args_s)[N], Args &... args) {
        std::string s = args_s;
        std::array<std::string, sizeof...(Args)> array;
        size_t pos = 0;
        for (size_t i = 0; i < array.size(); i++) {
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
            while (pos < s.length() && s[pos] != ',')
                array[i] += s[pos++];
            pos++;
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
        }
        const char *a[sizeof...(Args)];
        for (size_t i = 0; i < array.size(); i++) {
            a[i] = array[i].c_str();
        }
        accept<Visitor, Args...>(visitor, a, args...);
    }